

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.h
# Opt level: O0

void __thiscall fmp4_stream::emsg::emsg(emsg *this)

{
  allocator local_41;
  string local_40 [48];
  emsg *local_10;
  emsg *this_local;
  
  local_10 = this;
  full_box::full_box(&this->super_full_box);
  (this->super_full_box).super_box._vptr_box = (_func_int **)&PTR_size_00136d60;
  std::__cxx11::string::string((string *)&this->scheme_id_uri_);
  std::__cxx11::string::string((string *)&this->value_);
  this->presentation_time_delta_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->message_data_);
  zero_set(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"emsg",&local_41);
  std::__cxx11::string::operator=((string *)&(this->super_full_box).super_box.box_type_,local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return;
}

Assistant:

emsg() : presentation_time_delta_(0)
		{ 
			zero_set();
			this->box_type_ = std::string("emsg"); 
		}